

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDisjointSets.h
# Opt level: O2

void __thiscall HighsDisjointSets<false>::reset(HighsDisjointSets<false> *this,HighsInt numItems)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  value_type_conflict2 local_14;
  
  std::vector<int,_std::allocator<int>_>::_M_fill_assign(&this->sizes,(long)numItems,&local_14);
  std::vector<int,_std::allocator<int>_>::resize(&this->sets,(long)numItems);
  piVar1 = (this->sets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  iVar3 = 0;
  for (piVar2 = (this->sets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start; piVar2 != piVar1; piVar2 = piVar2 + 1) {
    *piVar2 = iVar3;
    iVar3 = iVar3 + 1;
  }
  return;
}

Assistant:

void reset(HighsInt numItems) {
    sizes.assign(numItems, 1);
    sets.resize(numItems);
    std::iota(sets.begin(), sets.end(), 0);
  }